

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

void Fraig_TablePrintStatsS(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pFVar1 = pMan->pTableS;
  printf("Structural table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  for (uVar5 = 0; (long)uVar5 < (long)pFVar1->nBins; uVar5 = uVar5 + 1) {
    ppFVar2 = pFVar1->pBins + uVar5;
    uVar4 = 0;
    while( true ) {
      uVar3 = (uint)uVar4;
      if (*ppFVar2 == (Fraig_Node_t *)0x0) break;
      uVar4 = (ulong)(uVar3 + 1);
      ppFVar2 = &(*ppFVar2)->pNextS;
    }
    if (1 < uVar3) {
      printf("%d ",uVar4);
      if (0x32 < uVar3) {
        printf("{%d} ",uVar5 & 0xffffffff);
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsS( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableS;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Structural table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryS( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
        {
            printf( "%d ", Counter );
            if ( Counter > 50 )
                printf( "{%d} ", i );
        }
    }
    printf( "\n" );
}